

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Rep *options;
  Comparator *pCVar1;
  bool bVar2;
  TableBuilder *in_RSI;
  string key;
  string handle_encoding;
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  BlockBuilder meta_index_block;
  string local_118;
  Slice local_f8;
  undefined1 local_e8 [32];
  BlockHandle local_c8;
  BlockHandle local_b8;
  BlockHandle local_a8;
  undefined1 local_98 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_80 [5];
  Slice local_28;
  
  options = in_RSI->rep_;
  Flush(in_RSI);
  if (options->closed != true) {
    options->closed = true;
    local_a8.offset_._0_4_ = 0xffffffff;
    local_a8.offset_._4_4_ = 0xffffffff;
    local_a8.size_._0_4_ = 0xffffffff;
    local_a8.size_._4_4_ = 0xffffffff;
    local_b8.offset_._0_4_ = 0xffffffff;
    local_b8.offset_._4_4_ = 0xffffffff;
    local_b8.size_._0_4_ = 0xffffffff;
    local_b8.size_._4_4_ = 0xffffffff;
    local_c8.offset_._0_4_ = 0xffffffff;
    local_c8.offset_._4_4_ = 0xffffffff;
    local_c8.size_._0_4_ = 0xffffffff;
    local_c8.size_._4_4_ = 0xffffffff;
    bVar2 = ok(in_RSI);
    if ((bVar2) && (options->filter_block != (FilterBlockBuilder *)0x0)) {
      local_98._0_16_ = (undefined1  [16])FilterBlockBuilder::Finish(options->filter_block);
      WriteRawBlock(in_RSI,(Slice *)local_98,kNoCompression,&local_a8);
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      BlockBuilder::BlockBuilder((BlockBuilder *)local_98,&options->options);
      if (options->filter_block != (FilterBlockBuilder *)0x0) {
        std::__cxx11::string::string((string *)&local_118,"filter.",(allocator *)local_e8);
        (*((options->options).filter_policy)->_vptr_FilterPolicy[2])();
        std::__cxx11::string::append((char *)&local_118);
        local_e8._0_8_ = local_e8 + 0x10;
        local_e8._8_8_ = (pointer)0x0;
        local_e8[0x10] = '\0';
        BlockHandle::EncodeTo(&local_a8,(string *)local_e8);
        local_f8.data_ = local_118._M_dataplus._M_p;
        local_f8.size_ = local_118._M_string_length;
        local_28.data_ = (char *)local_e8._0_8_;
        local_28.size_ = local_e8._8_8_;
        BlockBuilder::Add((BlockBuilder *)local_98,&local_f8,&local_28);
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)&local_118);
      }
      WriteBlock(in_RSI,(BlockBuilder *)local_98,&local_b8);
      BlockBuilder::~BlockBuilder((BlockBuilder *)local_98);
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      if (options->pending_index_entry == true) {
        pCVar1 = (options->options).comparator;
        (*pCVar1->_vptr_Comparator[5])(pCVar1,&options->last_key);
        local_98._8_8_ = 0;
        local_98._0_8_ = local_98 + 0x10;
        local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
        BlockHandle::EncodeTo(&options->pending_handle,(string *)local_98);
        local_118._M_dataplus._M_p = (options->last_key)._M_dataplus._M_p;
        local_118._M_string_length = (options->last_key)._M_string_length;
        local_e8._0_8_ = local_98._0_8_;
        local_e8._8_8_ = local_98._8_8_;
        BlockBuilder::Add(&options->index_block,(Slice *)&local_118,(Slice *)local_e8);
        options->pending_index_entry = false;
        std::__cxx11::string::~string((string *)local_98);
      }
      WriteBlock(in_RSI,&options->index_block,&local_c8);
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      local_98._4_4_ = local_b8.offset_._4_4_;
      local_98._0_4_ = (undefined4)local_b8.offset_;
      local_98._12_4_ = local_b8.size_._4_4_;
      local_98._8_4_ = (undefined4)local_b8.size_;
      local_98._16_8_ = CONCAT44(local_c8.offset_._4_4_,(undefined4)local_c8.offset_);
      aaStack_80[0]._0_8_ = CONCAT44(local_c8.size_._4_4_,(undefined4)local_c8.size_);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      Footer::EncodeTo((Footer *)local_98,&local_118);
      local_e8._0_8_ = local_118._M_dataplus._M_p;
      local_e8._8_8_ = local_118._M_string_length;
      (*options->file->_vptr_WritableFile[2])(&local_f8);
      Status::operator=(&options->status,(Status *)&local_f8);
      Status::~Status((Status *)&local_f8);
      if ((options->status).state_ == (char *)0x0) {
        options->offset = (uint64_t)(local_118._M_string_length + options->offset);
      }
      std::__cxx11::string::~string((string *)&local_118);
    }
    Status::Status((Status *)this,&options->status);
    return (Status)(char *)this;
  }
  __assert_fail("!r->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/table/table_builder.cc"
                ,0xca,"Status leveldb::TableBuilder::Finish()");
}

Assistant:

Status TableBuilder::Finish() {
        Rep *r = rep_;
        Flush();
        assert(!r->closed);
        r->closed = true;

        BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

        // Write filter block
        if (ok() && r->filter_block != NULL) {
            WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                          &filter_block_handle);
        }

        // Write metaindex block
        if (ok()) {
            BlockBuilder meta_index_block(&r->options);
            if (r->filter_block != NULL) {
                // Add mapping from "filter.Name" to location of filter data
                std::string key = "filter.";
                key.append(r->options.filter_policy->Name());
                std::string handle_encoding;
                filter_block_handle.EncodeTo(&handle_encoding);
                meta_index_block.Add(key, handle_encoding);
            }

            // TODO(postrelease): Add stats and other meta blocks
            WriteBlock(&meta_index_block, &metaindex_block_handle);
        }

        // Write index block
        if (ok()) {
            if (r->pending_index_entry) {
                r->options.comparator->FindShortSuccessor(&r->last_key);
                std::string handle_encoding;
                r->pending_handle.EncodeTo(&handle_encoding);
                r->index_block.Add(r->last_key, Slice(handle_encoding));
                r->pending_index_entry = false;
            }
            WriteBlock(&r->index_block, &index_block_handle);
        }

        // Write footer
        if (ok()) {
            Footer footer;
            footer.set_metaindex_handle(metaindex_block_handle);
            footer.set_index_handle(index_block_handle);
            std::string footer_encoding;
            footer.EncodeTo(&footer_encoding);
            r->status = r->file->Append(footer_encoding);
            if (r->status.ok()) {
                r->offset += footer_encoding.size();
            }
        }
        return r->status;
    }